

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O0

void __thiscall FIX::InvalidMessage::InvalidMessage(InvalidMessage *this,InvalidMessage *param_1)

{
  InvalidMessage *param_1_local;
  InvalidMessage *this_local;
  
  Exception::Exception(&this->super_Exception,&param_1->super_Exception);
  *(undefined ***)&this->super_Exception = &PTR__InvalidMessage_00330038;
  return;
}

Assistant:

InvalidMessage(const std::string &what = "")
      : Exception("Invalid message", what) {}